

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

bool __thiscall Am_Value_List::Member(Am_Value_List *this,Am_Wrapper *value)

{
  uint *puVar1;
  Am_List_Item *pAVar2;
  Am_List_Item *this_00;
  bool bVar3;
  
  pAVar2 = this->item;
  this_00 = pAVar2;
  while (this_00 != (Am_List_Item *)0x0) {
    bVar3 = Am_Value::operator==(&this_00->super_Am_Value,value);
    if (bVar3) goto LAB_0022bbe3;
    this_00 = this->item->next;
    this->item = this_00;
  }
  this->item = pAVar2;
LAB_0022bbe3:
  if (value != (Am_Wrapper *)0x0) {
    puVar1 = &value->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(value->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])(value);
    }
  }
  return this_00 != (Am_List_Item *)0x0;
}

Assistant:

bool
Am_Value_List::Member(Am_Wrapper *value)
{
  Am_List_Item *old_item = item;
  while (item) {
    if (*item == value) {
      if (value)
        value->Release();
      return true;
    }
    item = item->next;
  }
  item = old_item;
  if (value)
    value->Release();
  return false;
}